

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O1

void __thiscall NaDynAr<NaControlLawItem>::item::~item(item *this)

{
  if (this->pData == (NaControlLawItem *)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
  }
  if (this->pData != (NaControlLawItem *)0x0) {
    (*(this->pData->super_NaConfigPart)._vptr_NaConfigPart[1])();
  }
  this->pData = (NaControlLawItem *)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }